

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

char * build_ustar_entry_name(char *dest,char *src,size_t src_length,char *insert)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *__src;
  char *pcVar12;
  bool bVar13;
  
  if (insert == (char *)0x0) {
    lVar4 = 0;
  }
  else {
    sVar3 = strlen(insert);
    lVar4 = sVar3 + 2;
  }
  if (99 < src_length || insert != (char *)0x0) {
    bVar2 = 1;
LAB_004d3d78:
    do {
      bVar5 = bVar2;
      sVar9 = src_length;
      if (0 < (long)sVar9) {
        src_length = sVar9 - 1;
        bVar2 = 0;
        if (src[sVar9 - 1] == '/') goto LAB_004d3d78;
      }
      pcVar12 = src + sVar9;
      if (((long)sVar9 < 2) || (pcVar12[-1] != '.')) goto LAB_004d3daf;
      src_length = sVar9 - 2;
      bVar2 = 0;
      if (src[sVar9 - 2] != '/') goto LAB_004d3daf;
    } while( true );
  }
  strncpy(dest,src,src_length);
  pcVar8 = dest + src_length;
  goto LAB_004d3f27;
LAB_004d3daf:
  lVar7 = sVar9 - 1;
  pcVar11 = src + (sVar9 - 1);
  if ((long)sVar9 < 2) {
    bVar13 = false;
  }
  else {
    bVar13 = *pcVar11 != '/';
    lVar6 = lVar7;
    if (bVar13) {
      do {
        lVar7 = lVar6 + -1;
        if (lVar7 < 1) {
          lVar7 = 0;
          pcVar11 = src;
          goto LAB_004d3e04;
        }
        lVar1 = lVar6 + -1;
        lVar6 = lVar7;
      } while (src[lVar1] != '/');
      pcVar11 = src + lVar7;
    }
  }
LAB_004d3e04:
  lVar7 = (ulong)(byte)(*pcVar11 == '/' & bVar13) + lVar7;
  pcVar11 = src + lVar7;
  lVar4 = ((ulong)bVar5 | 0x62) - lVar4;
  if (pcVar11 + lVar4 < pcVar12) {
    pcVar12 = pcVar11 + lVar4;
  }
  sVar3 = (long)pcVar12 - (long)pcVar11;
  pcVar12 = src + 0x9b;
  __src = src + 0x9b;
  if (lVar7 < 0x9b) {
    pcVar12 = pcVar11;
    __src = pcVar11;
  }
  for (; (src < pcVar12 && (__src = pcVar12, *pcVar12 != '/')); pcVar12 = pcVar12 + -1) {
    __src = src;
  }
  if (__src < pcVar11) {
    __src = __src + (*__src == '/');
  }
  pcVar12 = __src + (lVar4 - sVar3);
  if (pcVar11 < __src + (lVar4 - sVar3)) {
    pcVar12 = pcVar11;
  }
  if (pcVar12 < __src) {
    pcVar12 = __src;
  }
  for (; (__src < pcVar12 && (*pcVar12 != '/')); pcVar12 = pcVar12 + -1) {
  }
  if (pcVar12 < pcVar11) {
    pcVar12 = pcVar12 + (*pcVar12 == '/');
  }
  sVar10 = (long)__src - (long)src;
  pcVar8 = dest;
  if (src <= __src && sVar10 != 0) {
    strncpy(dest,src,sVar10);
    pcVar8 = dest + sVar10;
  }
  sVar10 = (long)pcVar12 - (long)__src;
  if (__src <= pcVar12 && sVar10 != 0) {
    strncpy(pcVar8,__src,sVar10);
    pcVar8 = pcVar8 + sVar10;
  }
  if (insert != (char *)0x0) {
    strcpy(pcVar8,insert);
    sVar10 = strlen(insert);
    pcVar12 = pcVar8 + sVar10;
    pcVar8 = pcVar12 + 1;
    *pcVar12 = '/';
  }
  strncpy(pcVar8,pcVar11,sVar3);
  pcVar8 = pcVar8 + sVar3;
  if (bVar5 == 0) {
    *pcVar8 = '/';
    pcVar8 = pcVar8 + 1;
  }
LAB_004d3f27:
  *pcVar8 = '\0';
  return dest;
}

Assistant:

static char *
build_ustar_entry_name(char *dest, const char *src, size_t src_length,
    const char *insert)
{
	const char *prefix, *prefix_end;
	const char *suffix, *suffix_end;
	const char *filename, *filename_end;
	char *p;
	int need_slash = 0; /* Was there a trailing slash? */
	size_t suffix_length = 99;
	size_t insert_length;

	/* Length of additional dir element to be added. */
	if (insert == NULL)
		insert_length = 0;
	else
		/* +2 here allows for '/' before and after the insert. */
		insert_length = strlen(insert) + 2;

	/* Step 0: Quick bailout in a common case. */
	if (src_length < 100 && insert == NULL) {
		strncpy(dest, src, src_length);
		dest[src_length] = '\0';
		return (dest);
	}

	/* Step 1: Locate filename and enforce the length restriction. */
	filename_end = src + src_length;
	/* Remove trailing '/' chars and '/.' pairs. */
	for (;;) {
		if (filename_end > src && filename_end[-1] == '/') {
			filename_end --;
			need_slash = 1; /* Remember to restore trailing '/'. */
			continue;
		}
		if (filename_end > src + 1 && filename_end[-1] == '.'
		    && filename_end[-2] == '/') {
			filename_end -= 2;
			need_slash = 1; /* "foo/." will become "foo/" */
			continue;
		}
		break;
	}
	if (need_slash)
		suffix_length--;
	/* Find start of filename. */
	filename = filename_end - 1;
	while ((filename > src) && (*filename != '/'))
		filename --;
	if ((*filename == '/') && (filename < filename_end - 1))
		filename ++;
	/* Adjust filename_end so that filename + insert fits in 99 chars. */
	suffix_length -= insert_length;
	if (filename_end > filename + suffix_length)
		filename_end = filename + suffix_length;
	/* Calculate max size for "suffix" section (#3 above). */
	suffix_length -= filename_end - filename;

	/* Step 2: Locate the "prefix" section of the dirname, including
	 * trailing '/'. */
	prefix = src;
	prefix_end = prefix + 155;
	if (prefix_end > filename)
		prefix_end = filename;
	while (prefix_end > prefix && *prefix_end != '/')
		prefix_end--;
	if ((prefix_end < filename) && (*prefix_end == '/'))
		prefix_end++;

	/* Step 3: Locate the "suffix" section of the dirname,
	 * including trailing '/'. */
	suffix = prefix_end;
	suffix_end = suffix + suffix_length; /* Enforce limit. */
	if (suffix_end > filename)
		suffix_end = filename;
	if (suffix_end < suffix)
		suffix_end = suffix;
	while (suffix_end > suffix && *suffix_end != '/')
		suffix_end--;
	if ((suffix_end < filename) && (*suffix_end == '/'))
		suffix_end++;

	/* Step 4: Build the new name. */
	/* The OpenBSD strlcpy function is safer, but less portable. */
	/* Rather than maintain two versions, just use the strncpy version. */
	p = dest;
	if (prefix_end > prefix) {
		strncpy(p, prefix, prefix_end - prefix);
		p += prefix_end - prefix;
	}
	if (suffix_end > suffix) {
		strncpy(p, suffix, suffix_end - suffix);
		p += suffix_end - suffix;
	}
	if (insert != NULL) {
		/* Note: assume insert does not have leading or trailing '/' */
		strcpy(p, insert);
		p += strlen(insert);
		*p++ = '/';
	}
	strncpy(p, filename, filename_end - filename);
	p += filename_end - filename;
	if (need_slash)
		*p++ = '/';
	*p = '\0';

	return (dest);
}